

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O3

char * __thiscall timing::elapsed_time_readable(timing *this)

{
  short sVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  short sVar6;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->current).__d.__r = lVar4;
  iVar2 = (int)((double)(lVar4 - (this->start).__d.__r) / 1000000000.0);
  iVar3 = iVar2 % 0xe10;
  sVar1 = (short)iVar3;
  uVar5 = ((uint)(sVar1 * -0x7777) >> 0x10) + iVar3;
  sVar6 = ((short)uVar5 >> 5) + (short)((uVar5 & 0xffff) >> 0xf);
  sprintf(this->runtime,"%ih:%im:%is",(ulong)(uint)(iVar2 / 0xe10),(ulong)(uint)(int)sVar6,
          (ulong)(uint)(int)(short)(sVar1 + sVar6 * -0x3c));
  return this->runtime;
}

Assistant:

char *timing::elapsed_time_readable(){

    double diff_time=elapsed_time_seconds();
    int delta_time=int(diff_time);

    int runtime_hours=delta_time/3600;
    int runtime_minutes=(delta_time % 3600)/60;
    int runtime_seconds=(delta_time % 3600)%60;
    sprintf(runtime,"%ih:%im:%is",runtime_hours,runtime_minutes,runtime_seconds);

    return runtime;

}